

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

int Of_CutComputeTruthMux6
              (Of_Man_t *p,Of_Cut_t *pCut0,Of_Cut_t *pCut1,Of_Cut_t *pCutC,int fCompl0,int fCompl1,
              int fComplC,Of_Cut_t *pCutR)

{
  Vec_Mem_t *pVVar1;
  int iVar2;
  uint uVar3;
  word *pwVar4;
  word wVar5;
  word wVar6;
  word wVar7;
  word local_60;
  word tC;
  word t1;
  word t0;
  word t;
  int local_38;
  int fCompl;
  int truthId;
  int nOldSupp;
  int fCompl1_local;
  int fCompl0_local;
  Of_Cut_t *pCutC_local;
  Of_Cut_t *pCut1_local;
  Of_Cut_t *pCut0_local;
  Of_Man_t *p_local;
  
  fCompl = *(uint *)&pCutR->field_0x10 >> 0x1b;
  pVVar1 = p->vTtMem;
  truthId = fCompl1;
  nOldSupp = fCompl0;
  _fCompl1_local = pCutC;
  pCutC_local = pCut1;
  pCut1_local = pCut0;
  pCut0_local = (Of_Cut_t *)p;
  iVar2 = Abc_Lit2Var(*(uint *)&pCut0->field_0x10 & 0x7ffffff);
  pwVar4 = Vec_MemReadEntry(pVVar1,iVar2);
  t1 = *pwVar4;
  pVVar1 = *(Vec_Mem_t **)&pCut0_local->field_0x10;
  iVar2 = Abc_Lit2Var(*(uint *)&pCutC_local->field_0x10 & 0x7ffffff);
  pwVar4 = Vec_MemReadEntry(pVVar1,iVar2);
  tC = *pwVar4;
  pVVar1 = *(Vec_Mem_t **)&pCut0_local->field_0x10;
  iVar2 = Abc_Lit2Var(*(uint *)&_fCompl1_local->field_0x10 & 0x7ffffff);
  pwVar4 = Vec_MemReadEntry(pVVar1,iVar2);
  local_60 = *pwVar4;
  iVar2 = Abc_LitIsCompl(*(uint *)&pCut1_local->field_0x10 & 0x7ffffff);
  if (iVar2 != nOldSupp) {
    t1 = t1 ^ 0xffffffffffffffff;
  }
  iVar2 = Abc_LitIsCompl(*(uint *)&pCutC_local->field_0x10 & 0x7ffffff);
  if (iVar2 != truthId) {
    tC = tC ^ 0xffffffffffffffff;
  }
  iVar2 = Abc_LitIsCompl(*(uint *)&_fCompl1_local->field_0x10 & 0x7ffffff);
  if (iVar2 != fComplC) {
    local_60 = local_60 ^ 0xffffffffffffffff;
  }
  wVar5 = Abc_Tt6Expand(t1,pCut1_local->pLeaves,*(uint *)&pCut1_local->field_0x10 >> 0x1b,
                        pCutR->pLeaves,*(uint *)&pCutR->field_0x10 >> 0x1b);
  wVar6 = Abc_Tt6Expand(tC,pCutC_local->pLeaves,*(uint *)&pCutC_local->field_0x10 >> 0x1b,
                        pCutR->pLeaves,*(uint *)&pCutR->field_0x10 >> 0x1b);
  wVar7 = Abc_Tt6Expand(local_60,_fCompl1_local->pLeaves,
                        *(uint *)&_fCompl1_local->field_0x10 >> 0x1b,pCutR->pLeaves,
                        *(uint *)&pCutR->field_0x10 >> 0x1b);
  t0 = wVar7 & wVar6 | (wVar7 ^ 0xffffffffffffffff) & wVar5;
  t._4_4_ = (uint)t0 & 1;
  if ((t0 & 1) != 0) {
    t0 = t0 ^ 0xffffffffffffffff;
  }
  iVar2 = Abc_Tt6MinBase(&t0,pCutR->pLeaves,*(uint *)&pCutR->field_0x10 >> 0x1b);
  *(uint *)&pCutR->field_0x10 = *(uint *)&pCutR->field_0x10 & 0x7ffffff | iVar2 << 0x1b;
  if ((t0 & 1) == 0) {
    local_38 = Vec_MemHashInsert(*(Vec_Mem_t **)&pCut0_local->field_0x10,&t0);
    uVar3 = Abc_Var2Lit(local_38,t._4_4_);
    *(uint *)&pCutR->field_0x10 = *(uint *)&pCutR->field_0x10 & 0xf8000000 | uVar3 & 0x7ffffff;
    if ((int)(*(uint *)&pCutR->field_0x10 >> 0x1b) <= fCompl) {
      return (int)((int)(*(uint *)&pCutR->field_0x10 >> 0x1b) < fCompl);
    }
    __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                  ,0x138,
                  "int Of_CutComputeTruthMux6(Of_Man_t *, Of_Cut_t *, Of_Cut_t *, Of_Cut_t *, int, int, int, Of_Cut_t *)"
                 );
  }
  __assert_fail("(int)(t & 1) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                ,0x135,
                "int Of_CutComputeTruthMux6(Of_Man_t *, Of_Cut_t *, Of_Cut_t *, Of_Cut_t *, int, int, int, Of_Cut_t *)"
               );
}

Assistant:

static inline int Of_CutComputeTruthMux6( Of_Man_t * p, Of_Cut_t * pCut0, Of_Cut_t * pCut1, Of_Cut_t * pCutC, int fCompl0, int fCompl1, int fComplC, Of_Cut_t * pCutR )
{
    int nOldSupp = pCutR->nLeaves, truthId, fCompl; word t;
    word t0 = *Vec_MemReadEntry(p->vTtMem, Abc_Lit2Var(pCut0->iFunc));
    word t1 = *Vec_MemReadEntry(p->vTtMem, Abc_Lit2Var(pCut1->iFunc));
    word tC = *Vec_MemReadEntry(p->vTtMem, Abc_Lit2Var(pCutC->iFunc));
    if ( Abc_LitIsCompl(pCut0->iFunc) ^ fCompl0 ) t0 = ~t0;
    if ( Abc_LitIsCompl(pCut1->iFunc) ^ fCompl1 ) t1 = ~t1;
    if ( Abc_LitIsCompl(pCutC->iFunc) ^ fComplC ) tC = ~tC;
    t0 = Abc_Tt6Expand( t0, pCut0->pLeaves, pCut0->nLeaves, pCutR->pLeaves, pCutR->nLeaves );
    t1 = Abc_Tt6Expand( t1, pCut1->pLeaves, pCut1->nLeaves, pCutR->pLeaves, pCutR->nLeaves );
    tC = Abc_Tt6Expand( tC, pCutC->pLeaves, pCutC->nLeaves, pCutR->pLeaves, pCutR->nLeaves );
    t = (tC & t1) | (~tC & t0);
    if ( (fCompl = (int)(t & 1)) ) t = ~t;
    pCutR->nLeaves = Abc_Tt6MinBase( &t, pCutR->pLeaves, pCutR->nLeaves );
    assert( (int)(t & 1) == 0 );
    truthId        = Vec_MemHashInsert(p->vTtMem, &t);
    pCutR->iFunc   = Abc_Var2Lit( truthId, fCompl );
    assert( (int)pCutR->nLeaves <= nOldSupp );
    return (int)pCutR->nLeaves < nOldSupp;
}